

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O3

EVevent_list copy_EVevent_list(EVevent_list list)

{
  size_t size;
  void **ppvVar1;
  EVevent_list pbVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  
  if (list == (EVevent_list)0x0) {
    iVar4 = 1;
  }
  else {
    ppvVar1 = &list->buffer;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + 1;
      pvVar3 = *ppvVar1;
      ppvVar1 = ppvVar1 + 2;
    } while (pvVar3 != (void *)0x0);
  }
  pbVar2 = (EVevent_list)INT_CMmalloc((long)iVar4 << 4);
  if (iVar4 < 2) {
    uVar6 = 0;
  }
  else {
    uVar6 = (ulong)(iVar4 - 1);
    lVar5 = 0;
    do {
      size = *(size_t *)((long)&list->length + lVar5);
      *(size_t *)((long)&pbVar2->length + lVar5) = size;
      pvVar3 = INT_CMmalloc(size);
      *(void **)((long)&pbVar2->buffer + lVar5) = pvVar3;
      memcpy(pvVar3,*(void **)((long)&list->buffer + lVar5),*(size_t *)((long)&list->length + lVar5)
            );
      lVar5 = lVar5 + 0x10;
    } while (uVar6 << 4 != lVar5);
  }
  pbVar2[uVar6].length = 0;
  pbVar2[uVar6].buffer = (void *)0x0;
  return pbVar2;
}

Assistant:

EVevent_list
copy_EVevent_list(EVevent_list list)
{
    EVevent_list ret;
    int i, size = count_EVevent_list(list);
    ret = (EVevent_list) malloc(sizeof(ret[0]) * size);
    for (i=0; i < size-1; i++) {
        ret[i].length = list[i].length;
        ret[i].buffer = malloc(list[i].length);
        memcpy(ret[i].buffer, list[i].buffer, list[i].length);
    }
    ret[i].length = 0;
    ret[i].buffer = NULL;
    return ret;
}